

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastBooleanAndObjectEqLikely
          (Lowerer *this,Instr *instr,Opnd *src1,Opnd *src2,LabelInstr *labelHelper,
          LabelInstr *labelEqualLikely,bool *pNeedHelper,bool isInHelper)

{
  LowererMD *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  JITTimeFunctionBody *this_01;
  LabelInstr *labelHelper_00;
  BranchInstr *pBVar4;
  RegOpnd *pRVar5;
  uint uVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  *pNeedHelper = true;
  if (src2 != (Opnd *)0x0 && src1 != (Opnd *)0x0) {
    this_01 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsStrictMode(this_01);
    uVar6 = instr->m_opcode - 0x14;
    if (((uVar6 < 0x2f) && ((0x600000000003U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) ||
       (instr->m_opcode - 0x196 < 2)) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    local_34 = (src1->m_valueType).field_0;
    bVar3 = ValueType::IsLikelyBoolean((ValueType *)&local_34.field_0);
    if (bVar3) {
      local_32 = (src2->m_valueType).field_0;
      bVar3 = ValueType::IsLikelyBoolean((ValueType *)&local_32.field_0);
      if (bVar3) {
        if (!bVar1) {
          pRVar5 = IR::Opnd::AsRegOpnd(src1);
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar5->super_Opnd,instr,labelHelper,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src1);
          GenerateJSBooleanTest(this,pRVar5,instr,labelHelper,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src2);
LAB_00580e36:
          LowererMD::GenerateObjectTest
                    (&this->m_lowererMD,&pRVar5->super_Opnd,instr,labelHelper,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src2);
          bVar2 = GenerateJSBooleanTest(this,pRVar5,instr,labelEqualLikely,true);
          if (bVar2) {
            pBVar4 = IR::BranchInstr::New(JMP,labelHelper,this->m_func);
            IR::Instr::InsertBefore(instr,&pBVar4->super_Instr);
            return true;
          }
          return true;
        }
        local_34 = (src1->m_valueType).field_0;
        bVar2 = ValueType::IsBoolean((ValueType *)&local_34.field_0);
        if (!bVar2) {
          local_32 = (src2->m_valueType).field_0;
          bVar2 = ValueType::IsBoolean((ValueType *)&local_32.field_0);
          if (!bVar2) {
            pRVar5 = IR::Opnd::AsRegOpnd(src2);
            goto LAB_00580e36;
          }
        }
        *pNeedHelper = false;
        return true;
      }
    }
    local_34 = (src1->m_valueType).field_0;
    bVar3 = ValueType::HasBeenObject((ValueType *)&local_34.field_0);
    if (bVar3) {
      local_32 = (src2->m_valueType).field_0;
      bVar3 = ValueType::HasBeenObject((ValueType *)&local_32.field_0);
      if (bVar3) {
        labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,isInHelper);
        this_00 = &this->m_lowererMD;
        if (bVar1) {
          pRVar5 = IR::Opnd::AsRegOpnd(src2);
          LowererMD::GenerateObjectTest(this_00,&pRVar5->super_Opnd,instr,labelHelper,false);
        }
        else {
          pRVar5 = IR::Opnd::AsRegOpnd(src1);
          LowererMD::GenerateObjectTest(this_00,&pRVar5->super_Opnd,instr,labelHelper,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src2);
          LowererMD::GenerateObjectTest(this_00,&pRVar5->super_Opnd,instr,labelHelper,false);
          pRVar5 = IR::Opnd::AsRegOpnd(src1);
          GenerateIsDynamicObject(this,pRVar5,instr,labelHelper_00,false);
        }
        pRVar5 = IR::Opnd::AsRegOpnd(src2);
        GenerateIsDynamicObject(this,pRVar5,instr,labelEqualLikely,true);
        IR::Instr::InsertBefore(instr,&labelHelper_00->super_Instr);
        if (bVar2) {
          labelHelper_00->field_0x78 = labelHelper_00->field_0x78 | 2;
          pBVar4 = IR::BranchInstr::New(JMP,labelHelper,this->m_func);
          IR::Instr::InsertBefore(instr,&pBVar4->super_Instr);
          return true;
        }
        if (!bVar1) {
          pRVar5 = IR::Opnd::AsRegOpnd(src1);
          GenerateIsBuiltinRecyclableObject
                    (this,pRVar5,instr,labelHelper,false,(LabelInstr *)0x0,isInHelper);
        }
        pRVar5 = IR::Opnd::AsRegOpnd(src2);
        GenerateIsBuiltinRecyclableObject
                  (this,pRVar5,instr,labelHelper,false,(LabelInstr *)0x0,isInHelper);
        return true;
      }
    }
    local_34 = (src1->m_valueType).field_0;
    bVar2 = ValueType::IsLikelySymbol((ValueType *)&local_34.field_0);
    if (bVar2) {
      local_32 = (src2->m_valueType).field_0;
      bVar2 = ValueType::IsLikelySymbol((ValueType *)&local_32.field_0);
      if (bVar2) {
        pRVar5 = IR::Opnd::AsRegOpnd(src1);
        GenerateSymbolTest(this,pRVar5,instr,labelHelper,(LabelInstr *)0x0,true);
        pRVar5 = IR::Opnd::AsRegOpnd(src2);
        GenerateSymbolTest(this,pRVar5,instr,labelHelper,(LabelInstr *)0x0,true);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Lowerer::GenerateFastBooleanAndObjectEqLikely(IR::Instr * instr, IR::Opnd *src1, IR::Opnd *src2, IR::LabelInstr * labelHelper, IR::LabelInstr * labelEqualLikely, bool *pNeedHelper, bool isInHelper)
{
    *pNeedHelper = true;

    if (!src1 || !src2)
    {
        return false;
    }

    bool isStrictCompare = false;
    bool isStrictMode = this->m_func->GetJITFunctionBody()->IsStrictMode();

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmSrNeq_A:
        isStrictCompare = true;
        break;
    }

    if (src1->GetValueType().IsLikelyBoolean() && src2->GetValueType().IsLikelyBoolean())
    {
        //
        // Booleans
        //
        if (isStrictCompare)
        {
            if (!src1->GetValueType().IsBoolean() && !src2->GetValueType().IsBoolean())
            {
                this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
                if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
                {
                    instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
                }
            }
            else
            {
                *pNeedHelper = false;
            }
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            GenerateJSBooleanTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            if (GenerateJSBooleanTest(src2->AsRegOpnd(), instr, labelEqualLikely, true))
            {
                instr->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func));
            }
        }
    }
    else if (src1->GetValueType().HasBeenObject() && src2->GetValueType().HasBeenObject())
    {
        //
        // Objects
        //
        IR::LabelInstr *labelTypeIdCheck = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isInHelper);

        if (!isStrictCompare)
        {
            // If not strictBr, verify both sides are dynamic objects
            this->m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper, false);
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
            GenerateIsDynamicObject(src1->AsRegOpnd(), instr, labelTypeIdCheck, false);
        }
        else
        {
            this->m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper, false);
        }
        GenerateIsDynamicObject(src2->AsRegOpnd(), instr, labelEqualLikely, true);

        instr->InsertBefore(labelTypeIdCheck);

        if (isStrictMode)
        {
            labelTypeIdCheck->isOpHelper = true;
            IR::BranchInstr *branchToHelper = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelHelper, this->m_func);
            instr->InsertBefore(branchToHelper);
        }
        else
        {
            if (!ExternalLowerer::TryGenerateFastExternalEqTest(src1, src2, instr, labelHelper, labelEqualLikely, this, isStrictCompare, isInHelper))
            {
                if (!isStrictCompare)
                {
                    GenerateIsBuiltinRecyclableObject(src1->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
                }
                GenerateIsBuiltinRecyclableObject(src2->AsRegOpnd(), instr, labelHelper, false /*checkObjectAndDynamicObject*/, nullptr /*labelContinue*/, isInHelper);
            }
        }
    }
    else if (src1->GetValueType().IsLikelySymbol() && src2->GetValueType().IsLikelySymbol())
    {
        this->GenerateSymbolTest(src1->AsRegOpnd(), instr, labelHelper, nullptr, true);
        this->GenerateSymbolTest(src2->AsRegOpnd(), instr, labelHelper, nullptr, true);
    }
    else
    {
        return false;
    }

    return true;
}